

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.h
# Opt level: O2

bool __thiscall
libnbt::NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::equals(NBTTagData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *this,NBTBase *tag)

{
  bool bVar1;
  __type _Var2;
  
  bVar1 = NBTBase::equals(&this->super_NBTBase,tag);
  if (bVar1) {
    _Var2 = std::operator==(&this->_data,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (tag + 1));
    return _Var2;
  }
  return false;
}

Assistant:

bool equals(NBTBase &tag) override {
            if (NBTBase::equals(tag)) {
                return this->_data == ((NBTTagData<T> &) tag)._data;
            }
            return false;
        }